

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O2

void sptk::world::inv(double **r,int n,double **invr)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  int k_2;
  ulong uVar7;
  int j;
  ulong uVar8;
  long lVar9;
  int k_1;
  int k;
  long lVar10;
  int j_1;
  long lVar11;
  
  uVar7 = 0;
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  for (; uVar8 = 0, uVar7 != uVar6; uVar7 = uVar7 + 1) {
    for (; (uint)n != uVar8; uVar8 = uVar8 + 1) {
      invr[uVar7][uVar8] = 0.0;
    }
  }
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    invr[uVar8][uVar8] = 1.0;
  }
  lVar9 = 1;
  for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    pdVar2 = r[uVar7];
    dVar1 = pdVar2[uVar7];
    pdVar2[uVar7] = 1.0;
    pdVar3 = invr[uVar7];
    for (lVar11 = 0; lVar10 = lVar9, lVar9 != lVar11; lVar11 = lVar11 + 1) {
      pdVar3[lVar11] = pdVar3[lVar11] / dVar1;
    }
    for (; lVar11 = lVar9, (int)lVar10 < n; lVar10 = lVar10 + 1) {
      pdVar2[lVar10] = pdVar2[lVar10] / dVar1;
    }
    for (; (int)lVar11 < n; lVar11 = lVar11 + 1) {
      pdVar4 = r[lVar11];
      dVar1 = pdVar4[uVar7];
      pdVar5 = invr[lVar11];
      for (lVar10 = 0; uVar8 = uVar7, lVar9 != lVar10; lVar10 = lVar10 + 1) {
        pdVar5[lVar10] = pdVar5[lVar10] - pdVar3[lVar10] * dVar1;
      }
      for (; (uint)n != uVar8; uVar8 = uVar8 + 1) {
        pdVar4[uVar8] = pdVar4[uVar8] - pdVar2[uVar8] * dVar1;
      }
    }
    lVar9 = lVar9 + 1;
  }
  lVar9 = (long)n;
  while (0 < lVar9) {
    lVar9 = lVar9 + -1;
    for (lVar11 = 0; lVar11 < lVar9; lVar11 = lVar11 + 1) {
      dVar1 = r[lVar11][lVar9];
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        invr[lVar11][uVar7] = invr[lVar11][uVar7] - invr[lVar9][uVar7] * dVar1;
      }
    }
  }
  return;
}

Assistant:

void inv(double **r, int n, double **invr) {
  for (int i = 0; i < n; ++i)
    for (int j = 0; j < n; ++j) invr[i][j] = 0.0;
  for (int i = 0; i < n; ++i) invr[i][i] = 1.0;

  double tmp;
  for (int i = 0; i < n; ++i) {
    tmp = r[i][i];
    r[i][i] = 1.0;
    for (int j = 0; j <= i; ++j) invr[i][j] /= tmp;
    for (int j = i + 1; j < n; ++j) r[i][j] /= tmp;
    for (int j = i + 1; j < n; ++j) {
      tmp = r[j][i];
      for (int k = 0; k <= i; ++k) invr[j][k] -= invr[i][k] * tmp;
      for (int k = i; k < n; ++k) r[j][k] -= r[i][k] * tmp;
    }
  }

  for (int i = n - 1; i >= 0; --i) {
    for (int j = 0; j < i; ++j) {
      tmp = r[j][i];
      for (int k = 0; k < n; ++k) invr[j][k] -= invr[i][k] * tmp;
    }
  }
}